

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O1

void __thiscall aiMesh::~aiMesh(aiMesh *this)

{
  aiBone *paVar1;
  aiAnimMesh *this_00;
  aiFace *paVar2;
  uint *puVar3;
  void *pvVar4;
  uint a;
  long lVar5;
  ulong uVar6;
  
  if (this->mVertices != (aiVector3D *)0x0) {
    operator_delete__(this->mVertices);
  }
  if (this->mNormals != (aiVector3D *)0x0) {
    operator_delete__(this->mNormals);
  }
  if (this->mTangents != (aiVector3D *)0x0) {
    operator_delete__(this->mTangents);
  }
  if (this->mBitangents != (aiVector3D *)0x0) {
    operator_delete__(this->mBitangents);
  }
  lVar5 = 0;
  do {
    if (this->mTextureCoords[lVar5] != (aiVector3D *)0x0) {
      operator_delete__(this->mTextureCoords[lVar5]);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  lVar5 = 0;
  do {
    if (this->mColors[lVar5] != (aiColor4D *)0x0) {
      operator_delete__(this->mColors[lVar5]);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  if ((this->mNumBones != 0) && (this->mBones != (aiBone **)0x0)) {
    if (this->mNumBones != 0) {
      uVar6 = 0;
      do {
        paVar1 = this->mBones[uVar6];
        if (paVar1 != (aiBone *)0x0) {
          if (paVar1->mWeights != (aiVertexWeight *)0x0) {
            operator_delete__(paVar1->mWeights);
          }
          operator_delete(paVar1,0x450);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < this->mNumBones);
    }
    if (this->mBones != (aiBone **)0x0) {
      operator_delete__(this->mBones);
    }
  }
  if ((this->mNumAnimMeshes != 0) && (this->mAnimMeshes != (aiAnimMesh **)0x0)) {
    if (this->mNumAnimMeshes != 0) {
      uVar6 = 0;
      do {
        this_00 = this->mAnimMeshes[uVar6];
        if (this_00 != (aiAnimMesh *)0x0) {
          aiAnimMesh::~aiAnimMesh(this_00);
          operator_delete(this_00,0x4b0);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < this->mNumAnimMeshes);
    }
    if (this->mAnimMeshes != (aiAnimMesh **)0x0) {
      operator_delete__(this->mAnimMeshes);
    }
  }
  paVar2 = this->mFaces;
  if (paVar2 != (aiFace *)0x0) {
    puVar3 = paVar2[-1].mIndices;
    if (puVar3 != (uint *)0x0) {
      lVar5 = (long)puVar3 << 4;
      do {
        pvVar4 = *(void **)((long)&paVar2[-1].mIndices + lVar5);
        if (pvVar4 != (void *)0x0) {
          operator_delete__(pvVar4);
        }
        lVar5 = lVar5 + -0x10;
      } while (lVar5 != 0);
    }
    operator_delete__(&paVar2[-1].mIndices,(long)puVar3 << 4 | 8);
    return;
  }
  return;
}

Assistant:

~aiMesh() {
        delete [] mVertices;
        delete [] mNormals;
        delete [] mTangents;
        delete [] mBitangents;
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; a++) {
            delete [] mTextureCoords[a];
        }
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; a++) {
            delete [] mColors[a];
        }

        // DO NOT REMOVE THIS ADDITIONAL CHECK
        if (mNumBones && mBones)    {
            for( unsigned int a = 0; a < mNumBones; a++) {
                delete mBones[a];
            }
            delete [] mBones;
        }

        if (mNumAnimMeshes && mAnimMeshes)  {
            for( unsigned int a = 0; a < mNumAnimMeshes; a++) {
                delete mAnimMeshes[a];
            }
            delete [] mAnimMeshes;
        }

        delete [] mFaces;
    }